

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugScreen.cpp
# Opt level: O3

void __thiscall DebugScreen::draw(DebugScreen *this,RenderTarget *target,RenderStates states)

{
  undefined8 *puVar1;
  float fVar2;
  pointer pTVar3;
  pointer pNVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  Vector2f *pVVar8;
  long *plVar9;
  Vector2u VVar10;
  undefined8 *puVar11;
  Vector2u VVar12;
  ulong *puVar13;
  size_type *psVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  Text *field;
  pointer drawable;
  ulong uVar20;
  int iVar21;
  _Hash_node_base *p_Var22;
  float fVar23;
  float fVar24;
  Sprite sprite;
  Text textureField;
  ulong *local_3c8;
  uint local_3c0;
  undefined4 uStack_3bc;
  ulong local_3b8 [2];
  ulong *local_3a8;
  uint local_3a0;
  undefined4 uStack_39c;
  ulong local_398 [2];
  ulong *local_388;
  long local_380;
  ulong local_378;
  long lStack_370;
  ulong *local_368;
  long local_360;
  ulong local_358;
  long lStack_350;
  locale local_348 [8];
  string local_340;
  undefined8 *local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  Sprite local_2c0;
  Text local_1a0;
  
  if (this->visible_ != true) {
    return;
  }
  iVar7 = (this->borderTopLeft_).x;
  iVar18 = (this->windowSize_).x - (iVar7 + (this->borderBottomRight_).x);
  if (iVar18 < 1) {
    iVar18 = 0;
  }
  iVar15 = (this->borderTopLeft_).y;
  iVar21 = (this->windowSize_).y - (iVar15 + (this->borderBottomRight_).y);
  if (iVar21 < 1) {
    iVar21 = 0;
  }
  local_1a0.super_Drawable._vptr_Drawable = (_func_int **)CONCAT44((float)iVar15,(float)iVar7);
  sf::Transform::translate(&states.transform,(Vector2f *)&local_1a0);
  if (this->mode_ != textures) {
    if (this->mode_ != def) {
      return;
    }
    pTVar3 = (this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (drawable = (this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>._M_impl.
                    super__Vector_impl_data._M_start; drawable != pTVar3; drawable = drawable + 1) {
      sf::RenderTarget::draw(target,&drawable->super_Drawable,&states);
    }
    for (p_Var22 = (this->customFields_)._M_h._M_before_begin._M_nxt;
        p_Var22 != (_Hash_node_base *)0x0; p_Var22 = p_Var22->_M_nxt) {
      sf::RenderTarget::draw(target,(Drawable *)(p_Var22 + 5),&states);
    }
    return;
  }
  std::locale::locale((locale *)&local_340);
  sf::String::String((String *)&local_2c0,"Texture: none",(locale *)&local_340);
  sf::Text::Text(&local_1a0,(String *)&local_2c0,this->font_,this->characterSize_);
  if ((Vector2f *)local_2c0.super_Drawable._vptr_Drawable != &local_2c0.super_Transformable.m_origin
     ) {
    operator_delete(local_2c0.super_Drawable._vptr_Drawable);
  }
  std::locale::~locale((locale *)&local_340);
  pVVar8 = sf::Transformable::getPosition
                     (&((this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>.
                        _M_impl.super__Vector_impl_data._M_start)->super_Transformable);
  local_2c0.super_Drawable._vptr_Drawable =
       (_func_int **)CONCAT44((float)this->characterSize_ + (*pVVar8).y,(*pVVar8).x + 0.0);
  sf::Transformable::setPosition(&local_1a0.super_Transformable,(Vector2f *)&local_2c0);
  iVar7 = (this->modeStates_)._M_elems[(int)this->mode_];
  if (((long)iVar7 < 0) ||
     (pNVar4 = (this->textures_).
               super__Vector_base<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
               ._M_impl.super__Vector_impl_data._M_start,
     iVar15 = (int)((ulong)((long)(this->textures_).
                                  super__Vector_base<DebugScreen::NamedTexture,_std::allocator<DebugScreen::NamedTexture>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar4) >> 3),
     SBORROW4(iVar7,iVar15 * -0x33333333) == iVar7 + iVar15 * 0x33333333 < 0)) goto LAB_001406e2;
  pNVar4 = pNVar4 + iVar7;
  std::operator+(&local_2e0,"Texture: ",&pNVar4->name);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_2e0);
  local_388 = &local_378;
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_378 = *puVar13;
    lStack_370 = plVar9[3];
  }
  else {
    local_378 = *puVar13;
    local_388 = (ulong *)*plVar9;
  }
  local_380 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  VVar10 = sf::Texture::getSize(pNVar4->texture);
  cVar6 = '\x01';
  uVar17 = VVar10.x;
  if (9 < uVar17) {
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      uVar16 = VVar10.x;
      if (uVar16 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_001401d6;
      }
      if (uVar16 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_001401d6;
      }
      if (uVar16 < 10000) goto LAB_001401d6;
      VVar10 = (Vector2u)(((ulong)VVar10 & 0xffffffff) / 10000);
      cVar5 = cVar6 + '\x04';
    } while (99999 < uVar16);
    cVar6 = cVar6 + '\x01';
  }
LAB_001401d6:
  local_3a8 = local_398;
  std::__cxx11::string::_M_construct((ulong)&local_3a8,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3a8,local_3a0,uVar17);
  uVar20 = CONCAT44(uStack_39c,local_3a0) + local_380;
  uVar19 = 0xf;
  if (local_388 != &local_378) {
    uVar19 = local_378;
  }
  if (uVar19 < uVar20) {
    uVar19 = 0xf;
    if (local_3a8 != local_398) {
      uVar19 = local_398[0];
    }
    if (uVar19 < uVar20) goto LAB_00140248;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3a8,0,(char *)0x0,(ulong)local_388);
  }
  else {
LAB_00140248:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_3a8);
  }
  local_320 = &local_310;
  puVar1 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar1) {
    local_310 = *puVar1;
    uStack_308 = puVar11[3];
  }
  else {
    local_310 = *puVar1;
    local_320 = (undefined8 *)*puVar11;
  }
  local_318 = puVar11[1];
  *puVar11 = puVar1;
  puVar11[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_368 = &local_358;
  puVar13 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar13) {
    local_358 = *puVar13;
    lStack_350 = plVar9[3];
  }
  else {
    local_358 = *puVar13;
    local_368 = (ulong *)*plVar9;
  }
  local_360 = plVar9[1];
  *plVar9 = (long)puVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  VVar10 = sf::Texture::getSize(pNVar4->texture);
  uVar20 = (ulong)VVar10 >> 0x20;
  cVar6 = '\x01';
  if (4 < VVar10.y >> 1) {
    cVar5 = '\x04';
    do {
      cVar6 = cVar5;
      uVar17 = (uint)uVar20;
      if (uVar17 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_0014037b;
      }
      if (uVar17 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_0014037b;
      }
      if (uVar17 < 10000) goto LAB_0014037b;
      uVar20 = uVar20 / 10000;
      cVar5 = cVar6 + '\x04';
    } while (99999 < uVar17);
    cVar6 = cVar6 + '\x01';
  }
LAB_0014037b:
  local_3c8 = local_3b8;
  std::__cxx11::string::_M_construct((ulong)&local_3c8,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_3c8,local_3c0,VVar10.y);
  uVar20 = CONCAT44(uStack_3bc,local_3c0) + local_360;
  uVar19 = 0xf;
  if (local_368 != &local_358) {
    uVar19 = local_358;
  }
  if (uVar19 < uVar20) {
    uVar19 = 0xf;
    if (local_3c8 != local_3b8) {
      uVar19 = local_3b8[0];
    }
    if (uVar19 < uVar20) goto LAB_001403f3;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_3c8,0,(char *)0x0,(ulong)local_368);
  }
  else {
LAB_001403f3:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_368,(ulong)local_3c8);
  }
  local_300 = &local_2f0;
  puVar1 = puVar11 + 2;
  if ((undefined8 *)*puVar11 == puVar1) {
    local_2f0 = *puVar1;
    uStack_2e8 = puVar11[3];
  }
  else {
    local_2f0 = *puVar1;
    local_300 = (undefined8 *)*puVar11;
  }
  local_2f8 = puVar11[1];
  *puVar11 = puVar1;
  puVar11[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_300);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  psVar14 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_340.field_2._M_allocated_capacity = *psVar14;
    local_340.field_2._8_8_ = plVar9[3];
  }
  else {
    local_340.field_2._M_allocated_capacity = *psVar14;
    local_340._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_340._M_string_length = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::locale::locale(local_348);
  sf::String::String((String *)&local_2c0,&local_340,local_348);
  sf::Text::setString(&local_1a0,(String *)&local_2c0);
  if ((Vector2f *)local_2c0.super_Drawable._vptr_Drawable != &local_2c0.super_Transformable.m_origin
     ) {
    operator_delete(local_2c0.super_Drawable._vptr_Drawable);
  }
  std::locale::~locale(local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320);
  }
  if (local_3a8 != local_398) {
    operator_delete(local_3a8);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  sf::Sprite::Sprite(&local_2c0,pNVar4->texture);
  pVVar8 = sf::Transformable::getPosition(&local_1a0.super_Transformable);
  sf::Transformable::setPosition
            (&local_2c0.super_Transformable,0.0,(float)this->characterSize_ + pVVar8->y + 4.0);
  pVVar8 = sf::Transformable::getPosition(&local_2c0.super_Transformable);
  fVar23 = pVVar8->x;
  VVar10 = sf::Texture::getSize(pNVar4->texture);
  pVVar8 = sf::Transformable::getPosition(&local_2c0.super_Transformable);
  fVar2 = pVVar8->y;
  VVar12 = sf::Texture::getSize(pNVar4->texture);
  fVar24 = ((float)iVar18 - fVar23) / (float)((ulong)VVar10 & 0xffffffff);
  fVar23 = ((float)iVar21 - fVar2) / (float)((ulong)VVar12 >> 0x20);
  if (fVar24 <= fVar23) {
    fVar23 = fVar24;
  }
  sf::Transformable::setScale(&local_2c0.super_Transformable,fVar23,fVar23);
  sf::RenderTarget::draw(target,&local_2c0.super_Drawable,&states);
  sf::Transformable::~Transformable(&local_2c0.super_Transformable);
LAB_001406e2:
  sf::RenderTarget::draw
            (target,&((this->fields_).super__Vector_base<sf::Text,_std::allocator<sf::Text>_>.
                      _M_impl.super__Vector_impl_data._M_start)->super_Drawable,&states);
  sf::RenderTarget::draw(target,&local_1a0.super_Drawable,&states);
  local_1a0.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_0027d7a8;
  local_1a0.super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_0027d7d0;
  local_1a0.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_0027d828;
  if (local_1a0.m_outlineVertices.m_vertices.
      super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1a0.m_outlineVertices.m_vertices.
                    super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1a0.m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_0027d828;
  if (local_1a0.m_vertices.m_vertices.super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a0.m_vertices.m_vertices.
                    super__Vector_base<sf::Vertex,_std::allocator<sf::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_1a0.m_string.m_string._M_dataplus._M_p != &local_1a0.m_string.m_string.field_2) {
    operator_delete(local_1a0.m_string.m_string._M_dataplus._M_p);
  }
  sf::Transformable::~Transformable(&local_1a0.super_Transformable);
  return;
}

Assistant:

void DebugScreen::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!visible_) {
        return;
    }

    sf::Vector2i clippedSize = {
        std::max(static_cast<int>(windowSize_.x) - borderTopLeft_.x - borderBottomRight_.x, 0),
        std::max(static_cast<int>(windowSize_.y) - borderTopLeft_.y - borderBottomRight_.y, 0),
    };
    states.transform.translate(static_cast<sf::Vector2f>(borderTopLeft_));

    if (mode_ == Mode::def) {
        for (const auto& field : fields_) {
            target.draw(field, states);
        }
        for (const auto& custom : customFields_) {
            target.draw(custom.second, states);
        }
    } else if (mode_ == Mode::textures) {
        sf::Text textureField("Texture: none", font_, characterSize_);
        textureField.setPosition(fields_[0].getPosition() + sf::Vector2f(0.0f, 1.0f * characterSize_));
        if (modeStates_[static_cast<int>(mode_)] >= 0 && modeStates_[static_cast<int>(mode_)] < static_cast<int>(textures_.size())) {
            const NamedTexture& namedTex = textures_[modeStates_[static_cast<int>(mode_)]];
            textureField.setString("Texture: " + namedTex.name + " (size " + std::to_string(namedTex.texture->getSize().x) + " by " + std::to_string(namedTex.texture->getSize().y) + ")");

            sf::Sprite sprite(*namedTex.texture);
            sprite.setPosition(0.0f, textureField.getPosition().y + 1.0f * characterSize_ + 4.0f);
            float scaleX = (clippedSize.x - sprite.getPosition().x) / namedTex.texture->getSize().x;
            float scaleY = (clippedSize.y - sprite.getPosition().y) / namedTex.texture->getSize().y;
            float scale = std::min(scaleX, scaleY);
            sprite.setScale(scale, scale);
            target.draw(sprite, states);
        }

        target.draw(fields_[0], states);
        target.draw(textureField, states);
    }
}